

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlSAX2EndDocument(void *ctx)

{
  xmlDocPtr doc;
  long lVar1;
  uint uVar2;
  xmlChar *pxVar3;
  xmlParserCtxtPtr ctxt;
  
  if (ctx != (void *)0x0) {
    if ((((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
        (doc = *(xmlDocPtr *)((long)ctx + 0x10), doc != (xmlDocPtr)0x0)) &&
       (doc->intSubset != (_xmlDtd *)0x0)) {
      uVar2 = xmlValidateDocumentFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),doc);
      *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar2;
    }
    if (((*(long *)((long)ctx + 0x28) != 0) && (lVar1 = *(long *)((long)ctx + 0x10), lVar1 != 0)) &&
       (*(long *)(lVar1 + 0x70) == 0)) {
      *(long *)(lVar1 + 0x70) = *(long *)((long)ctx + 0x28);
      *(undefined8 *)((long)ctx + 0x28) = 0;
    }
    if (((*(long **)((long)ctx + 0x48) != (long *)0x0) && (0 < *(int *)((long)ctx + 0x40))) &&
       ((lVar1 = **(long **)((long)ctx + 0x48), lVar1 != 0 &&
        (((pxVar3 = *(xmlChar **)(lVar1 + 0x50), pxVar3 != (xmlChar *)0x0 &&
          (*(long *)((long)ctx + 0x10) != 0)) &&
         (*(long *)(*(long *)((long)ctx + 0x10) + 0x70) == 0)))))) {
      pxVar3 = xmlStrdup(pxVar3);
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x70) = pxVar3;
    }
    if (((*(int *)((long)ctx + 0x198) != 0) && (lVar1 = *(long *)((long)ctx + 0x10), lVar1 != 0)) &&
       (*(int *)(lVar1 + 0x90) == 0)) {
      *(int *)(lVar1 + 0x90) = *(int *)((long)ctx + 0x198);
    }
  }
  return;
}

Assistant:

void
xmlSAX2EndDocument(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2EndDocument()\n");
#endif
    if (ctx == NULL) return;
#ifdef LIBXML_VALID_ENABLED
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
	ctxt->valid &= xmlValidateDocumentFinal(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Grab the encoding if it was added on-the-fly
     */
    if ((ctxt->encoding != NULL) && (ctxt->myDoc != NULL) &&
	(ctxt->myDoc->encoding == NULL)) {
	ctxt->myDoc->encoding = ctxt->encoding;
	ctxt->encoding = NULL;
    }
    if ((ctxt->inputTab != NULL) &&
        (ctxt->inputNr > 0) && (ctxt->inputTab[0] != NULL) &&
        (ctxt->inputTab[0]->encoding != NULL) && (ctxt->myDoc != NULL) &&
	(ctxt->myDoc->encoding == NULL)) {
	ctxt->myDoc->encoding = xmlStrdup(ctxt->inputTab[0]->encoding);
    }
    if ((ctxt->charset != XML_CHAR_ENCODING_NONE) && (ctxt->myDoc != NULL) &&
	(ctxt->myDoc->charset == XML_CHAR_ENCODING_NONE)) {
	ctxt->myDoc->charset = ctxt->charset;
    }
}